

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseTextNode(DOMRangeImpl *this,DOMNode *n,bool isLeft,int how)

{
  undefined8 uVar1;
  MemoryManager *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t XVar4;
  ulong uVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  MemoryManager *pMVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  DOMDocumentImpl *local_7f68;
  DOMDocumentImpl *local_7f48;
  DOMDocumentImpl *local_7f08;
  DOMDocumentImpl *local_7ee8;
  DOMDocumentImpl *local_7e90;
  DOMDocumentImpl *local_7e70;
  DOMDocumentImpl *local_7e28;
  DOMDocumentImpl *local_7e08;
  undefined1 local_7db8 [8];
  XMLCh newTemp_1 [4000];
  XMLCh *newNodeValue_1;
  DOMNode *newNode_1;
  XMLCh oldTemp_1 [4000];
  DOMNode **local_3f20;
  XMLCh *oldNodeValue_1;
  XMLSize_t offset_1;
  XMLSize_t endLen;
  XMLCh newTemp [4000];
  XMLCh *local_1fc0;
  XMLCh *newNodeValue;
  DOMNode *newNode;
  undefined1 local_1fa8 [8];
  XMLCh oldTemp [4000];
  XMLCh *oldNodeValue;
  XMLSize_t offset;
  XMLSize_t startLen;
  ArrayJanitor<char16_t> janValue;
  XMLCh *txtValue;
  int how_local;
  bool isLeft_local;
  DOMNode *n_local;
  DOMRangeImpl *this_local;
  undefined4 extraout_var_01;
  
  iVar3 = (*n->_vptr_DOMNode[3])();
  janValue.fMemoryManager =
       (MemoryManager *)
       XMLString::replicate((XMLCh *)CONCAT44(extraout_var,iVar3),this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&startLen,(char16_t *)janValue.fMemoryManager,
             this->fMemoryManager);
  if (isLeft) {
    iVar3 = (*this->fStartContainer->_vptr_DOMNode[3])();
    XVar4 = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var_00,iVar3));
    iVar3 = (*(this->super_DOMRange)._vptr_DOMRange[3])();
    uVar5 = CONCAT44(extraout_var_01,iVar3);
    if (uVar5 == 0) {
      if (how != 2) {
        (*n->_vptr_DOMNode[0x13])(n,&XMLUni::fgZeroLenString);
      }
    }
    else {
      if (uVar5 < 3999) {
        oldTemp._7992_8_ = local_1fa8;
      }
      else {
        oldTemp._7992_4_ =
             (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar5 * 2 + 2);
        oldTemp._7996_4_ = extraout_var_02;
      }
      pMVar2 = janValue.fMemoryManager;
      uVar1 = oldTemp._7992_8_;
      if (this->fDocument == (DOMDocument *)0x0) {
        local_7e08 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_7e08 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
      }
      pMVar6 = DOMDocumentImpl::getMemoryManager(local_7e08);
      XMLString::subString((XMLCh *)uVar1,(XMLCh *)pMVar2,0,uVar5,pMVar6);
      if (how != 2) {
        if (this->fDocument == (DOMDocument *)0x0) {
          local_7e28 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_7e28 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
        }
        pXVar7 = DOMDocumentImpl::getPooledString(local_7e28,(XMLCh *)oldTemp._7992_8_);
        (*n->_vptr_DOMNode[0x13])(n,pXVar7);
      }
      if (0xf9e < uVar5) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,oldTemp._7992_8_);
      }
    }
    if (how == 3) {
      this_local = (DOMRangeImpl *)0x0;
    }
    else {
      iVar3 = (*n->_vptr_DOMNode[0xd])(n,0);
      this_local = (DOMRangeImpl *)CONCAT44(extraout_var_03,iVar3);
      if (XVar4 == uVar5) {
        (*(this_local->super_DOMRange)._vptr_DOMRange[0x13])(this_local,&XMLUni::fgZeroLenString);
      }
      else {
        if (uVar5 < 3999) {
          local_1fc0 = (XMLCh *)&endLen;
        }
        else {
          iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                            (this->fMemoryManager,uVar5 * 2 + 2);
          local_1fc0 = (XMLCh *)CONCAT44(extraout_var_04,iVar3);
        }
        pMVar2 = janValue.fMemoryManager;
        if (this->fDocument == (DOMDocument *)0x0) {
          local_7e70 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_7e70 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
        }
        pMVar6 = DOMDocumentImpl::getMemoryManager(local_7e70);
        XMLString::subString(local_1fc0,(XMLCh *)pMVar2,uVar5,XVar4,pMVar6);
        if (this->fDocument == (DOMDocument *)0x0) {
          local_7e90 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_7e90 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
        }
        pXVar7 = DOMDocumentImpl::getPooledString(local_7e90,local_1fc0);
        (*(this_local->super_DOMRange)._vptr_DOMRange[0x13])(this_local,pXVar7);
        if (0xf9e < uVar5) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,local_1fc0);
        }
      }
    }
  }
  else {
    iVar3 = (*this->fEndContainer->_vptr_DOMNode[3])();
    XVar4 = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var_05,iVar3));
    iVar3 = (*(this->super_DOMRange)._vptr_DOMRange[5])();
    uVar5 = CONCAT44(extraout_var_06,iVar3);
    if (XVar4 == uVar5) {
      if (how != 2) {
        (*n->_vptr_DOMNode[0x13])(n,&XMLUni::fgZeroLenString);
      }
    }
    else {
      if (uVar5 < 3999) {
        local_3f20 = &newNode_1;
      }
      else {
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar5 * 2 + 2);
        local_3f20 = (DOMNode **)CONCAT44(extraout_var_07,iVar3);
      }
      pMVar2 = janValue.fMemoryManager;
      if (this->fDocument == (DOMDocument *)0x0) {
        local_7ee8 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_7ee8 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
      }
      pMVar6 = DOMDocumentImpl::getMemoryManager(local_7ee8);
      XMLString::subString((XMLCh *)local_3f20,(XMLCh *)pMVar2,uVar5,XVar4,pMVar6);
      if (how != 2) {
        if (this->fDocument == (DOMDocument *)0x0) {
          local_7f08 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_7f08 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
        }
        pXVar7 = DOMDocumentImpl::getPooledString(local_7f08,(XMLCh *)local_3f20);
        (*n->_vptr_DOMNode[0x13])(n,pXVar7);
      }
      if (0xf9e < uVar5) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,local_3f20);
      }
    }
    if (how == 3) {
      this_local = (DOMRangeImpl *)0x0;
    }
    else {
      iVar3 = (*n->_vptr_DOMNode[0xd])(n,0);
      this_local = (DOMRangeImpl *)CONCAT44(extraout_var_08,iVar3);
      if (uVar5 == 0) {
        (*(this_local->super_DOMRange)._vptr_DOMRange[0x13])(this_local,&XMLUni::fgZeroLenString);
      }
      else {
        if (uVar5 < 3999) {
          newTemp_1._7992_8_ = local_7db8;
        }
        else {
          newTemp_1._7992_4_ =
               (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar5 * 2 + 2);
          newTemp_1._7996_4_ = extraout_var_09;
        }
        pMVar2 = janValue.fMemoryManager;
        uVar1 = newTemp_1._7992_8_;
        if (this->fDocument == (DOMDocument *)0x0) {
          local_7f48 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_7f48 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
        }
        pMVar6 = DOMDocumentImpl::getMemoryManager(local_7f48);
        XMLString::subString((XMLCh *)uVar1,(XMLCh *)pMVar2,0,uVar5,pMVar6);
        if (this->fDocument == (DOMDocument *)0x0) {
          local_7f68 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_7f68 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
        }
        pXVar7 = DOMDocumentImpl::getPooledString(local_7f68,(XMLCh *)newTemp_1._7992_8_);
        (*(this_local->super_DOMRange)._vptr_DOMRange[0x13])(this_local,pXVar7);
        if (0xf9e < uVar5) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,newTemp_1._7992_8_);
        }
      }
    }
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&startLen);
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMRangeImpl::traverseTextNode( DOMNode*n, bool isLeft, int how )
{
    XMLCh* txtValue = XMLString::replicate(n->getNodeValue(), fMemoryManager);
    ArrayJanitor<XMLCh> janValue(txtValue, fMemoryManager);

    if ( isLeft )
    {
        XMLSize_t startLen = XMLString::stringLen(fStartContainer->getNodeValue());
        XMLSize_t offset = getStartOffset();

        if (offset == 0) {
            if ( how != CLONE_CONTENTS )
                n->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* oldNodeValue;
            XMLCh oldTemp[4000];

            if (offset >= 3999)  {
                oldNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                oldNodeValue = oldTemp;
            }
            XMLString::subString(oldNodeValue, txtValue, 0, offset, ((DOMDocumentImpl *)fDocument)->getMemoryManager());

            if ( how != CLONE_CONTENTS )
                n->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(oldNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(oldNodeValue);//delete[] oldNodeValue;
        }

        if ( how==DELETE_CONTENTS )
            return 0;

        DOMNode* newNode = n->cloneNode( false );

        if (startLen == offset) {
            newNode->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* newNodeValue;
            XMLCh newTemp[4000];

            if (offset >= 3999)  {
                newNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                newNodeValue = newTemp;
            }
            XMLString::subString(newNodeValue, txtValue, offset, startLen, ((DOMDocumentImpl *)fDocument)->getMemoryManager());
            newNode->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(newNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(newNodeValue);//delete[] newNodeValue;

        }
        return newNode;
    }
    else
    {
        XMLSize_t endLen = XMLString::stringLen(fEndContainer->getNodeValue());
        XMLSize_t offset = getEndOffset();

        if (endLen == offset) {
            if ( how != CLONE_CONTENTS )
                n->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* oldNodeValue;
            XMLCh oldTemp[4000];

            if (offset >= 3999)  {
                oldNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                oldNodeValue = oldTemp;
            }
            XMLString::subString(oldNodeValue, txtValue, offset, endLen, ((DOMDocumentImpl *)fDocument)->getMemoryManager());

            if ( how != CLONE_CONTENTS )
                n->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(oldNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(oldNodeValue);//delete[] oldNodeValue;
        }

        if ( how==DELETE_CONTENTS )
            return 0;

        DOMNode* newNode = n->cloneNode( false );

        if (offset == 0) {
            newNode->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* newNodeValue;
            XMLCh newTemp[4000];

            if (offset >= 3999)  {
                newNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                newNodeValue = newTemp;
            }
            XMLString::subString(newNodeValue, txtValue, 0, offset, ((DOMDocumentImpl *)fDocument)->getMemoryManager());
            newNode->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(newNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(newNodeValue);//delete[] newNodeValue;

        }
        return newNode;
    }
}